

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[10],char_const*,char[4],char[9],unsigned_int,char[46]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [10],char **Args_1,
          char (*Args_2) [4],char (*Args_3) [9],uint *Args_4,char (*Args_5) [46])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[4],char[9],unsigned_int,char[46]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [10])this,(char **)Args,(char (*) [4])Args_1,(char (*) [9])Args_2,
             (uint *)Args_3,(char (*) [46])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}